

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O1

void benchmark_wmutex_uncontended(testing t)

{
  condition_variable *this;
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  unique_lock<std::mutex> local_40;
  
  iVar1 = testing_n(t);
  piVar3 = (int *)operator_new(0x60);
  *piVar3 = 0;
  piVar3[2] = 0;
  piVar3[3] = 0;
  piVar3[4] = 0;
  piVar3[5] = 0;
  piVar3[6] = 0;
  piVar3[7] = 0;
  piVar3[8] = 0;
  piVar3[9] = 0;
  piVar3[10] = 0;
  piVar3[0xb] = 0;
  this = (condition_variable *)(piVar3 + 0xc);
  std::condition_variable::condition_variable(this);
  if (iVar1 != 0) {
    iVar4 = 0;
    do {
      local_40._M_owns = false;
      local_40._M_device = (mutex_type *)(piVar3 + 2);
      std::unique_lock<std::mutex>::lock(&local_40);
      while (*piVar3 != 0) {
        std::condition_variable::wait((unique_lock *)this);
      }
      *piVar3 = -1;
      std::unique_lock<std::mutex>::unlock(&local_40);
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      local_40._M_owns = false;
      local_40._M_device = (mutex_type *)(piVar3 + 2);
      std::unique_lock<std::mutex>::lock(&local_40);
      iVar2 = *piVar3;
      if (iVar2 == -1) {
        iVar2 = 0;
LAB_00105e43:
        *piVar3 = iVar2;
      }
      else if (0 < iVar2) {
        iVar2 = iVar2 + -1;
        goto LAB_00105e43;
      }
      if (*piVar3 == 0) {
        std::condition_variable::notify_all();
      }
      std::unique_lock<std::mutex>::unlock(&local_40);
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar1);
  }
  std::condition_variable::~condition_variable(this);
  operator_delete(piVar3);
  return;
}

Assistant:

static void benchmark_wmutex_uncontended (testing t) {
	int i;
	int n = testing_n (t);
	pthread_rwlock_t mu;
	pthread_rwlock_init (&mu, NULL);
	for (i = 0; i != n; i++) {
		pthread_rwlock_wrlock (&mu);
		pthread_rwlock_unlock (&mu);
	}
	pthread_rwlock_destroy (&mu);
}